

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_reset_min_row_height(nk_context *ctx)

{
  float fVar1;
  nk_panel *pnVar2;
  float fVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x44c5,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar2 = ctx->current->layout;
    if (pnVar2 != (nk_panel *)0x0) {
      fVar3 = ((ctx->style).font)->height;
      (pnVar2->row).min_height = fVar3;
      fVar1 = (ctx->style).text.padding.y;
      fVar3 = fVar1 + fVar1 + fVar3;
      (pnVar2->row).min_height = fVar3;
      fVar1 = (ctx->style).window.min_row_height_padding;
      (pnVar2->row).min_height = fVar1 + fVar1 + fVar3;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x44c7,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x44c6,"void nk_layout_reset_min_row_height(struct nk_context *)");
}

Assistant:

NK_API void
nk_layout_reset_min_row_height(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    layout->row.min_height = ctx->style.font->height;
    layout->row.min_height += ctx->style.text.padding.y*2;
    layout->row.min_height += ctx->style.window.min_row_height_padding*2;
}